

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O1

void __thiscall piksel::Graphics::rotate(Graphics *this,float rad)

{
  undefined8 uVar1;
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar2;
  _Elt_pointer pSVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float a;
  
  psVar2 = this->stateStack;
  pSVar3 = (psVar2->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar3 == (psVar2->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar3 = (psVar2->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  fVar4 = cosf(rad);
  fVar5 = sinf(rad);
  fVar7 = (1.0 - fVar4) * 0.0;
  fVar19 = fVar7 * 0.0;
  fVar20 = fVar19 + fVar4;
  fVar16 = fVar19 + fVar5;
  fVar21 = fVar5 * -0.0 + fVar7;
  fVar19 = fVar19 - fVar5;
  fVar7 = fVar5 * 0.0 + fVar7;
  fVar4 = (1.0 - fVar4) + fVar4;
  uVar1 = *(undefined8 *)&pSVar3[-1].shaderRelevantState.modelMatrix.value[0].field_0;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)((long)&pSVar3[-1].shaderRelevantState.modelMatrix.value[0].field_0 + 8);
  fVar8 = (float)uVar1;
  fVar9 = (float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)&pSVar3[-1].shaderRelevantState.modelMatrix.value[1].field_0;
  fVar10 = (float)uVar1;
  fVar11 = (float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)((long)&pSVar3[-1].shaderRelevantState.modelMatrix.value[1].field_0 + 8);
  fVar12 = (float)uVar1;
  fVar14 = (float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)&pSVar3[-1].shaderRelevantState.modelMatrix.value[2].field_0;
  fVar17 = (float)uVar1;
  fVar18 = (float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)((long)&pSVar3[-1].shaderRelevantState.modelMatrix.value[2].field_0 + 8);
  fVar13 = (float)uVar1;
  fVar15 = (float)((ulong)uVar1 >> 0x20);
  pSVar3[-1].shaderRelevantState.modelMatrix.value[0].field_0.field_0.x =
       fVar21 * fVar17 + fVar16 * fVar10 + fVar20 * fVar5;
  pSVar3[-1].shaderRelevantState.modelMatrix.value[0].field_0.field_0.y =
       fVar21 * fVar18 + fVar16 * fVar11 + fVar20 * fVar6;
  pSVar3[-1].shaderRelevantState.modelMatrix.value[0].field_0.field_0.z =
       fVar21 * fVar13 + fVar16 * fVar12 + fVar20 * fVar8;
  pSVar3[-1].shaderRelevantState.modelMatrix.value[0].field_0.field_0.w =
       fVar21 * fVar15 + fVar16 * fVar14 + fVar20 * fVar9;
  pSVar3[-1].shaderRelevantState.modelMatrix.value[1].field_0.field_0.x =
       fVar7 * fVar17 + fVar20 * fVar10 + fVar5 * fVar19;
  pSVar3[-1].shaderRelevantState.modelMatrix.value[1].field_0.field_0.y =
       fVar7 * fVar18 + fVar20 * fVar11 + fVar6 * fVar19;
  pSVar3[-1].shaderRelevantState.modelMatrix.value[1].field_0.field_0.z =
       fVar7 * fVar13 + fVar20 * fVar12 + fVar19 * fVar8;
  pSVar3[-1].shaderRelevantState.modelMatrix.value[1].field_0.field_0.w =
       fVar7 * fVar15 + fVar20 * fVar14 + fVar19 * fVar9;
  pSVar3[-1].shaderRelevantState.modelMatrix.value[2].field_0.field_0.x =
       fVar17 * fVar4 + fVar10 * fVar21 + fVar5 * fVar7;
  pSVar3[-1].shaderRelevantState.modelMatrix.value[2].field_0.field_0.y =
       fVar18 * fVar4 + fVar11 * fVar21 + fVar6 * fVar7;
  pSVar3[-1].shaderRelevantState.modelMatrix.value[2].field_0.field_0.z =
       fVar13 * fVar4 + fVar12 * fVar21 + fVar8 * fVar7;
  pSVar3[-1].shaderRelevantState.modelMatrix.value[2].field_0.field_0.w =
       fVar15 * fVar4 + fVar14 * fVar21 + fVar9 * fVar7;
  return;
}

Assistant:

State& Graphics::peek() {
    return stateStack.top();
}